

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleFileMuxer.cpp
# Opt level: O2

bool __thiscall SingleFileMuxer::doFlush(SingleFileMuxer *this)

{
  _Base_ptr dstFile;
  MuxerManager *this_00;
  _Base_ptr __dest;
  _Base_ptr p_Var1;
  uint uVar2;
  uint uVar3;
  ulong __n;
  
  for (p_Var1 = (this->m_streamInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_streamInfo)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    dstFile = p_Var1[1]._M_parent;
    uVar3 = *(uint *)((long)&dstFile[3]._M_left + 4);
    uVar2 = uVar3 & 0xffff;
    __n = (ulong)uVar2;
    uVar3 = uVar3 & 0x7fff0000;
    this_00 = (this->super_AbstractMuxer).m_owner;
    if (this_00->m_asyncMode == true) {
      if (uVar2 == 0) {
        MuxerManager::asyncWriteBuffer
                  (this_00,&this->super_AbstractMuxer,(uint8_t *)dstFile[3]._M_parent,uVar3,
                   (AbstractOutputStream *)dstFile);
        dstFile[3]._M_parent = (_Base_ptr)0x0;
      }
      else {
        __dest = (_Base_ptr)operator_new__(__n);
        memcpy(__dest,(void *)((long)&(dstFile[3]._M_parent)->_M_color + (ulong)uVar3),__n);
        MuxerManager::asyncWriteBuffer
                  (this_00,&this->super_AbstractMuxer,(uint8_t *)dstFile[3]._M_parent,uVar3,
                   (AbstractOutputStream *)dstFile);
        dstFile[3]._M_parent = __dest;
      }
    }
    else {
      MuxerManager::syncWriteBuffer
                (this_00,&this->super_AbstractMuxer,(uint8_t *)dstFile[3]._M_parent,uVar3,
                 (AbstractOutputStream *)dstFile);
      memmove(dstFile[3]._M_parent,(void *)((long)&(dstFile[3]._M_parent)->_M_color + (ulong)uVar3),
              __n);
    }
    *(uint *)((long)&dstFile[3]._M_left + 4) = uVar2;
  }
  return true;
}

Assistant:

bool SingleFileMuxer::doFlush()
{
    for (const auto& [fst, snd] : m_streamInfo)
    {
        StreamInfo* streamInfo = snd;
        const int lastBlockSize = streamInfo->m_bufLen & 0xffff;  // last 64K of data
        const int roundBufLen = streamInfo->m_bufLen & 0x7fff0000;
        if (m_owner->isAsyncMode())
        {
            if (lastBlockSize > 0)
            {
                const auto newBuff = new uint8_t[lastBlockSize];
                memcpy(newBuff, streamInfo->m_buffer + roundBufLen, lastBlockSize);
                m_owner->asyncWriteBuffer(this, streamInfo->m_buffer, roundBufLen, &streamInfo->m_file);
                streamInfo->m_buffer = newBuff;
            }
            else
            {
                m_owner->asyncWriteBuffer(this, streamInfo->m_buffer, roundBufLen, &streamInfo->m_file);
                streamInfo->m_buffer = nullptr;
            }
        }
        else
        {
            m_owner->syncWriteBuffer(this, streamInfo->m_buffer, roundBufLen, &streamInfo->m_file);
            memmove(streamInfo->m_buffer, streamInfo->m_buffer + roundBufLen, lastBlockSize);
        }
        streamInfo->m_bufLen = lastBlockSize;
    }
    return true;
}